

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptIterationStatement
          (HlslGrammar *this,TIntermNode **statement,TAttributes *attributes)

{
  TIntermAggregate *pTVar1;
  bool bVar2;
  TIntermTyped *local_68;
  TIntermTyped *iterator;
  TIntermNode *initNode;
  TIntermLoop *loopNode;
  TIntermTyped *pTStack_48;
  EHlslTokenClass loop;
  TIntermTyped *condition;
  TSourceLoc loc;
  TAttributes *attributes_local;
  TIntermNode **statement_local;
  HlslGrammar *this_local;
  
  condition = (TIntermTyped *)(this->super_HlslTokenStream).token.loc.name;
  loc.name = *(TString **)&(this->super_HlslTokenStream).token.loc.string;
  loc.string = (this->super_HlslTokenStream).token.loc.column;
  loc.line = *(int *)&(this->super_HlslTokenStream).token.loc.field_0x14;
  pTStack_48 = (TIntermTyped *)0x0;
  loc._16_8_ = attributes;
  loopNode._4_4_ = HlslTokenStream::peek(&this->super_HlslTokenStream);
  bVar2 = true;
  if ((loopNode._4_4_ != EHTokDo) && (bVar2 = true, loopNode._4_4_ != EHTokFor)) {
    bVar2 = loopNode._4_4_ == EHTokWhile;
  }
  if (!bVar2) {
    __assert_fail("loop == EHTokDo || loop == EHTokFor || loop == EHTokWhile",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslGrammar.cpp"
                  ,0xfb9,
                  "bool glslang::HlslGrammar::acceptIterationStatement(TIntermNode *&, const TAttributes &)"
                 );
  }
  HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
  initNode = (TIntermNode *)0x0;
  if (loopNode._4_4_ == EHTokFor) {
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
    if (!bVar2) {
      expected(this,"(");
    }
    HlslParseContext::pushScope(this->parseContext);
    iterator = (TIntermTyped *)0x0;
    bVar2 = acceptSimpleStatement(this,(TIntermNode **)&iterator);
    if (!bVar2) {
      expected(this,"for-loop initializer statement");
    }
    HlslParseContext::nestLooping(this->parseContext);
    (this->parseContext->super_TParseContextBase).controlFlowNestingLevel =
         (this->parseContext->super_TParseContextBase).controlFlowNestingLevel + 1;
    acceptExpression(this,&stack0xffffffffffffffb8);
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
    if (!bVar2) {
      expected(this,";");
    }
    if ((pTStack_48 != (TIntermTyped *)0x0) &&
       (pTStack_48 = HlslParseContext::convertConditionalExpression
                               (this->parseContext,(TSourceLoc *)&condition,pTStack_48,true),
       pTStack_48 == (TIntermTyped *)0x0)) {
      return false;
    }
    local_68 = (TIntermTyped *)0x0;
    acceptExpression(this,&local_68);
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
    if (!bVar2) {
      expected(this,")");
    }
    bVar2 = acceptScopedStatement(this,statement);
    if (!bVar2) {
      expected(this,"for sub-statement");
      return false;
    }
    pTVar1 = TIntermediate::addForLoop
                       (this->intermediate,*statement,&iterator->super_TIntermNode,pTStack_48,
                        local_68,true,(TSourceLoc *)&condition,(TIntermLoop **)&initNode);
    *statement = (TIntermNode *)pTVar1;
    HlslParseContext::popScope(this->parseContext);
    HlslParseContext::unnestLooping(this->parseContext);
    (this->parseContext->super_TParseContextBase).controlFlowNestingLevel =
         (this->parseContext->super_TParseContextBase).controlFlowNestingLevel + -1;
  }
  else if (loopNode._4_4_ == EHTokDo) {
    HlslParseContext::nestLooping(this->parseContext);
    (this->parseContext->super_TParseContextBase).controlFlowNestingLevel =
         (this->parseContext->super_TParseContextBase).controlFlowNestingLevel + 1;
    bVar2 = acceptScopedStatement(this,statement);
    if (!bVar2) {
      expected(this,"do sub-statement");
      return false;
    }
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokWhile);
    if (!bVar2) {
      expected(this,"while");
      return false;
    }
    bVar2 = acceptParenExpression(this,&stack0xffffffffffffffb8);
    if (!bVar2) {
      return false;
    }
    pTStack_48 = HlslParseContext::convertConditionalExpression
                           (this->parseContext,(TSourceLoc *)&condition,pTStack_48,true);
    if (pTStack_48 == (TIntermTyped *)0x0) {
      return false;
    }
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
    if (!bVar2) {
      expected(this,";");
    }
    HlslParseContext::unnestLooping(this->parseContext);
    (this->parseContext->super_TParseContextBase).controlFlowNestingLevel =
         (this->parseContext->super_TParseContextBase).controlFlowNestingLevel + -1;
    initNode = &TIntermediate::addLoop
                          (this->intermediate,*statement,pTStack_48,(TIntermTyped *)0x0,false,
                           (TSourceLoc *)&condition)->super_TIntermNode;
    *statement = initNode;
  }
  else {
    if (loopNode._4_4_ != EHTokWhile) {
      return false;
    }
    HlslParseContext::pushScope(this->parseContext);
    HlslParseContext::nestLooping(this->parseContext);
    (this->parseContext->super_TParseContextBase).controlFlowNestingLevel =
         (this->parseContext->super_TParseContextBase).controlFlowNestingLevel + 1;
    bVar2 = acceptParenExpression(this,&stack0xffffffffffffffb8);
    if (!bVar2) {
      return false;
    }
    pTStack_48 = HlslParseContext::convertConditionalExpression
                           (this->parseContext,(TSourceLoc *)&condition,pTStack_48,true);
    if (pTStack_48 == (TIntermTyped *)0x0) {
      return false;
    }
    bVar2 = acceptScopedStatement(this,statement);
    if (!bVar2) {
      expected(this,"while sub-statement");
      return false;
    }
    HlslParseContext::unnestLooping(this->parseContext);
    HlslParseContext::popScope(this->parseContext);
    (this->parseContext->super_TParseContextBase).controlFlowNestingLevel =
         (this->parseContext->super_TParseContextBase).controlFlowNestingLevel + -1;
    initNode = &TIntermediate::addLoop
                          (this->intermediate,*statement,pTStack_48,(TIntermTyped *)0x0,true,
                           (TSourceLoc *)&condition)->super_TIntermNode;
    *statement = initNode;
  }
  HlslParseContext::handleLoopAttributes
            (this->parseContext,(TSourceLoc *)&condition,(TIntermLoop *)initNode,
             (TAttributes *)loc._16_8_);
  return true;
}

Assistant:

bool HlslGrammar::acceptIterationStatement(TIntermNode*& statement, const TAttributes& attributes)
{
    TSourceLoc loc = token.loc;
    TIntermTyped* condition = nullptr;

    EHlslTokenClass loop = peek();
    assert(loop == EHTokDo || loop == EHTokFor || loop == EHTokWhile);

    //  WHILE or DO or FOR
    advanceToken();

    TIntermLoop* loopNode = nullptr;
    switch (loop) {
    case EHTokWhile:
        // so that something declared in the condition is scoped to the lifetime
        // of the while sub-statement
        parseContext.pushScope();  // this only needs to work right if no errors
        parseContext.nestLooping();
        ++parseContext.controlFlowNestingLevel;

        // LEFT_PAREN condition RIGHT_PAREN
        if (! acceptParenExpression(condition))
            return false;
        condition = parseContext.convertConditionalExpression(loc, condition);
        if (condition == nullptr)
            return false;

        // statement
        if (! acceptScopedStatement(statement)) {
            expected("while sub-statement");
            return false;
        }

        parseContext.unnestLooping();
        parseContext.popScope();
        --parseContext.controlFlowNestingLevel;

        loopNode = intermediate.addLoop(statement, condition, nullptr, true, loc);
        statement = loopNode;
        break;

    case EHTokDo:
        parseContext.nestLooping();  // this only needs to work right if no errors
        ++parseContext.controlFlowNestingLevel;

        // statement
        if (! acceptScopedStatement(statement)) {
            expected("do sub-statement");
            return false;
        }

        // WHILE
        if (! acceptTokenClass(EHTokWhile)) {
            expected("while");
            return false;
        }

        // LEFT_PAREN condition RIGHT_PAREN
        if (! acceptParenExpression(condition))
            return false;
        condition = parseContext.convertConditionalExpression(loc, condition);
        if (condition == nullptr)
            return false;

        if (! acceptTokenClass(EHTokSemicolon))
            expected(";");

        parseContext.unnestLooping();
        --parseContext.controlFlowNestingLevel;

        loopNode = intermediate.addLoop(statement, condition, nullptr, false, loc);
        statement = loopNode;
        break;

    case EHTokFor:
    {
        // LEFT_PAREN
        if (! acceptTokenClass(EHTokLeftParen))
            expected("(");

        // so that something declared in the condition is scoped to the lifetime
        // of the for sub-statement
        parseContext.pushScope();

        // initializer
        TIntermNode* initNode = nullptr;
        if (! acceptSimpleStatement(initNode))
            expected("for-loop initializer statement");

        parseContext.nestLooping();  // this only needs to work right if no errors
        ++parseContext.controlFlowNestingLevel;

        // condition SEMI_COLON
        acceptExpression(condition);
        if (! acceptTokenClass(EHTokSemicolon))
            expected(";");
        if (condition != nullptr) {
            condition = parseContext.convertConditionalExpression(loc, condition);
            if (condition == nullptr)
                return false;
        }

        // iterator SEMI_COLON
        TIntermTyped* iterator = nullptr;
        acceptExpression(iterator);
        if (! acceptTokenClass(EHTokRightParen))
            expected(")");

        // statement
        if (! acceptScopedStatement(statement)) {
            expected("for sub-statement");
            return false;
        }

        statement = intermediate.addForLoop(statement, initNode, condition, iterator, true, loc, loopNode);

        parseContext.popScope();
        parseContext.unnestLooping();
        --parseContext.controlFlowNestingLevel;

        break;
    }

    default:
        return false;
    }

    parseContext.handleLoopAttributes(loc, loopNode, attributes);
    return true;
}